

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O3

void __thiscall QStackedLayout::setStackingMode(QStackedLayout *this,StackingMode stackingMode)

{
  uint uVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  QWidget *this_00;
  uint uVar5;
  ulong uVar6;
  QStackedLayoutPrivate *d;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  QRect local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QLayout).field_0x8;
  if (*(StackingMode *)(lVar2 + 0xcc) != stackingMode) {
    *(StackingMode *)(lVar2 + 0xcc) = stackingMode;
    uVar5 = (uint)*(undefined8 *)(lVar2 + 0xc0);
    if (uVar5 != 0) {
      if (stackingMode == StackAll) {
        local_48.x1.m_i = 0;
        local_48.y1.m_i = 0;
        local_48.x2.m_i = -1;
        local_48.y2.m_i = -1;
        if ((-1 < (long)*(int *)(lVar2 + 200)) &&
           (lVar4 = (**(code **)(**(long **)(*(long *)(lVar2 + 0xb8) +
                                            (long)*(int *)(lVar2 + 200) * 8) + 0x68))(), lVar4 != 0)
           ) {
          local_48._0_8_ = *(undefined8 *)(*(long *)(lVar4 + 0x20) + 0x14);
          local_48._8_8_ = *(undefined8 *)(*(long *)(lVar4 + 0x20) + 0x1c);
        }
        if (0 < (int)uVar5) {
          uVar6 = 0;
          do {
            this_00 = (QWidget *)
                      (**(code **)(**(long **)(*(long *)(lVar2 + 0xb8) + uVar6 * 8) + 0x68))();
            if (this_00 != (QWidget *)0x0) {
              iVar8 = -(uint)(local_48.x2.m_i == local_48.x1.m_i + -1);
              iVar9 = -(uint)(local_48.y2.m_i == local_48.y1.m_i + -1);
              auVar7._4_4_ = iVar8;
              auVar7._0_4_ = iVar8;
              auVar7._8_4_ = iVar9;
              auVar7._12_4_ = iVar9;
              iVar8 = movmskpd((int)this_00,auVar7);
              if (iVar8 != 3) {
                QWidget::setGeometry(this_00,&local_48);
              }
              (**(code **)(*(long *)this_00 + 0x68))(this_00,1);
            }
            uVar6 = uVar6 + 1;
          } while ((uVar5 & 0x7fffffff) != uVar6);
        }
      }
      else if ((stackingMode == StackOne) &&
              (uVar1 = *(uint *)(lVar2 + 200), 0 < (int)uVar5 && (ulong)uVar1 != 0)) {
        uVar6 = 0;
        do {
          plVar3 = (long *)(**(code **)(**(long **)(*(long *)(lVar2 + 0xb8) + uVar6 * 8) + 0x68))();
          if (plVar3 != (long *)0x0) {
            (**(code **)(*plVar3 + 0x68))(plVar3,uVar1 == uVar6);
          }
          uVar6 = uVar6 + 1;
        } while ((uVar5 & 0x7fffffff) != uVar6);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStackedLayout::setStackingMode(StackingMode stackingMode)
{
    Q_D(QStackedLayout);
    if (d->stackingMode == stackingMode)
        return;
    d->stackingMode = stackingMode;

    const int n = d->list.size();
    if (n == 0)
        return;

    switch (d->stackingMode) {
    case StackOne:
        if (const int idx = currentIndex())
            for (int i = 0; i < n; ++i)
                if (QWidget *widget = d->list.at(i)->widget())
                    widget->setVisible(i == idx);
        break;
    case StackAll: { // Turn overlay on: Make sure all widgets are the same size
        QRect geometry;
        if (const QWidget *widget = currentWidget())
            geometry = widget->geometry();
        for (int i = 0; i < n; ++i)
            if (QWidget *widget = d->list.at(i)->widget()) {
                if (!geometry.isNull())
                    widget->setGeometry(geometry);
                widget->setVisible(true);
            }
    }
        break;
    }
}